

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

tcache_t * duckdb_je_tcache_create_explicit(tsd_t *tsd)

{
  long *plVar1;
  ulong *puVar2;
  tcache_t *tcache;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  arena_t *paVar6;
  ulong uVar7;
  undefined8 uVar8;
  tcache_t *tcache_00;
  rtree_leaf_elm_t *prVar9;
  atomic_p_t aVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  tcache_t *tcache_01;
  long lVar14;
  cache_bin_info_t *duckdb_je_tcache_bin_info;
  tsd_t *tsd_00;
  size_t usize;
  rtree_ctx_t *prVar15;
  size_t tcache_size;
  size_t alignment;
  rtree_ctx_t rtree_ctx_fallback;
  
  duckdb_je_cache_bin_info_compute_alloc
            (opt_tcache_ncached_max,duckdb_je_global_do_not_change_tcache_nbins,&tcache_size,
             &alignment);
  uVar12 = (int)tcache_size + 0x79fU & 0xfffffff8;
  uVar13 = (ulong)uVar12;
  if (alignment < 0x1001 && uVar12 < 0x3801) {
    uVar13 = -alignment & (alignment + uVar13) - 1;
    if (uVar13 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar13 + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < uVar13) goto LAB_00cedc9d;
      uVar11 = uVar13 * 2 - 1;
      lVar14 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar14 ^ 0x3f) & 0x3f);
      usize = ~uVar11 + uVar13 & uVar11;
    }
    uVar11 = 0x4000;
    if (0x3fff < usize) goto LAB_00cedca2;
  }
  else if (alignment < 0x7000000000000001) {
    uVar11 = 0x4000;
    if (0x4000 < uVar12) {
      uVar11 = uVar13 * 2 - 1;
      lVar14 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar14 ^ 0x3f) & 0x3f);
      uVar11 = ~uVar11 + uVar13 & uVar11;
      if (uVar11 < uVar13) goto LAB_00cedc9d;
    }
LAB_00cedca2:
    usize = 0;
    if (uVar11 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar11) -
                  0x1000) {
      usize = uVar11;
    }
  }
  else {
LAB_00cedc9d:
    usize = 0;
  }
  aVar10 = duckdb_je_arenas[0];
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    aVar10.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
  }
  if (tsd == (tsd_t *)0x0) {
    duckdb_je_tcache_bin_info = (cache_bin_info_t *)&DAT_00000001;
    tcache_00 = (tcache_t *)
                duckdb_je_arena_palloc
                          ((tsdn_t *)0x0,(arena_t *)aVar10.repr,usize,alignment,true,usize < 0x3801,
                           (tcache_t *)0x0);
    if (tcache_00 == (tcache_t *)0x0) {
      return (tcache_t *)0x0;
    }
    prVar15 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar15);
  }
  else {
    duckdb_je_tcache_bin_info = (cache_bin_info_t *)&DAT_00000001;
    tcache_00 = (tcache_t *)
                duckdb_je_arena_palloc
                          ((tsdn_t *)tsd,(arena_t *)aVar10.repr,usize,alignment,true,usize < 0x3801,
                           (tcache_t *)0x0);
    if (tcache_00 == (tcache_t *)0x0) {
      return (tcache_t *)0x0;
    }
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar12 = (uint)((ulong)tcache_00 >> 0x1e) & 0xf;
  uVar11 = (ulong)tcache_00 & 0xffffffffc0000000;
  uVar13 = (ulong)(uVar12 << 4);
  puVar2 = (ulong *)((long)&prVar15->cache[0].leafkey + uVar13);
  uVar13 = *(ulong *)((long)&prVar15->cache[0].leafkey + uVar13);
  if (uVar13 == uVar11) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar15->l2_cache[0].leafkey == uVar11) {
    prVar9 = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = uVar13;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar11;
    puVar2[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8));
  }
  else {
    lVar14 = 0x118;
    do {
      if (*(ulong *)((long)prVar15->cache + lVar14 + -8) == uVar11) {
        uVar7 = *(ulong *)((long)&prVar15->cache[0].leafkey + lVar14);
        puVar3 = (undefined8 *)((long)prVar15->cache + lVar14 + -0x18);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)prVar15->cache + lVar14 + -8);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        *(ulong *)((long)prVar15->cache + lVar14 + -0x18) = uVar13;
        *(ulong *)((long)(prVar15->cache + -1) + lVar14) = puVar2[1];
        *puVar2 = uVar11;
        puVar2[1] = uVar7;
        prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + uVar7);
        goto LAB_00cedda1;
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x188);
    duckdb_je_tcache_bin_info = (cache_bin_info_t *)&DAT_00000001;
    prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar15,
                        (uintptr_t)tcache_00,true,false);
  }
LAB_00cedda1:
  pvVar5 = duckdb_je_arenas
           [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff].
           repr;
  if (tsd == (tsd_t *)0x0) {
    prVar15 = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(prVar15);
  }
  else {
    prVar15 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar13 = (ulong)(uVar12 << 4);
  puVar2 = (ulong *)((long)&prVar15->cache[0].leafkey + uVar13);
  uVar13 = *(ulong *)((long)&prVar15->cache[0].leafkey + uVar13);
  if (uVar13 == uVar11) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar15->l2_cache[0].leafkey == uVar11) {
    prVar9 = prVar15->l2_cache[0].leaf;
    prVar15->l2_cache[0].leafkey = uVar13;
    prVar15->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar11;
    puVar2[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8));
  }
  else {
    lVar14 = 0x118;
    do {
      if (*(ulong *)((long)prVar15->cache + lVar14 + -8) == uVar11) {
        uVar7 = *(ulong *)((long)&prVar15->cache[0].leafkey + lVar14);
        puVar3 = (undefined8 *)((long)prVar15->cache + lVar14 + -0x18);
        uVar8 = puVar3[1];
        puVar4 = (undefined8 *)((long)prVar15->cache + lVar14 + -8);
        *puVar4 = *puVar3;
        puVar4[1] = uVar8;
        *(ulong *)((long)prVar15->cache + lVar14 + -0x18) = uVar13;
        *(ulong *)((long)(prVar15->cache + -1) + lVar14) = puVar2[1];
        *puVar2 = uVar11;
        puVar2[1] = uVar7;
        prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + uVar7);
        goto LAB_00ceddf0;
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x188);
    duckdb_je_tcache_bin_info = (cache_bin_info_t *)&DAT_00000001;
    prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar15,
                        (uintptr_t)tcache_00,true,false);
  }
LAB_00ceddf0:
  LOCK();
  plVar1 = (long *)((long)pvVar5 + 0x48);
  *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
  UNLOCK();
  lVar14 = CONCAT44(tcache_size._4_4_,(int)tcache_size);
  tcache = (tcache_t *)((long)tcache_00->bins + lVar14 + -8);
  tsd_00 = (tsd_t *)((long)tcache_00[1].bins + lVar14 + -8);
  *(uint *)((long)&tcache_00[1].bins[1].low_bits_low_water + lVar14) =
       duckdb_je_global_do_not_change_tcache_nbins;
  tcache_init(tsd_00,(tcache_slow_t *)tcache,tcache_00,opt_tcache_ncached_max,
              duckdb_je_tcache_bin_info);
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
    aVar10.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
       (aVar10.repr = duckdb_je_arena_choose_hard(tsd,true),
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
      paVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
      if (paVar6 != (arena_t *)0x0) {
        if (paVar6 == (arena_t *)aVar10.repr) goto LAB_00cede58;
        tcache_arena_dissociate
                  ((tsdn_t *)tsd,
                   &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,tcache_01
                  );
      }
      duckdb_je_tcache_arena_associate
                ((tsdn_t *)tsd,
                 &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                 &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                 (arena_t *)aVar10.repr);
    }
  }
  else {
    aVar10 = duckdb_je_arenas[0];
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      aVar10.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
    }
  }
LAB_00cede58:
  duckdb_je_tcache_arena_associate
            ((tsdn_t *)tsd,(tcache_slow_t *)tsd_00,tcache,(arena_t *)aVar10.repr);
  return tcache;
}

Assistant:

tcache_t *
tcache_create_explicit(tsd_t *tsd) {
	/*
	 * We place the cache bin stacks, then the tcache_t, then a pointer to
	 * the beginning of the whole allocation (for freeing).  The makes sure
	 * the cache bins have the requested alignment.
	 */
	unsigned tcache_nbins = global_do_not_change_tcache_nbins;
	size_t tcache_size, alignment;
	cache_bin_info_compute_alloc(tcache_get_default_ncached_max(),
	    tcache_nbins, &tcache_size, &alignment);

	size_t size = tcache_size + sizeof(tcache_t)
	    + sizeof(tcache_slow_t);
	/* Naturally align the pointer stacks. */
	size = PTR_CEILING(size);
	size = sz_sa2u(size, alignment);

	void *mem = ipallocztm(tsd_tsdn(tsd), size, alignment,
	    true, NULL, true, arena_get(TSDN_NULL, 0, true));
	if (mem == NULL) {
		return NULL;
	}
	tcache_t *tcache = (void *)((byte_t *)mem + tcache_size);
	tcache_slow_t *tcache_slow =
	    (void *)((byte_t *)mem + tcache_size + sizeof(tcache_t));
	tcache_default_settings_init(tcache_slow);
	tcache_init(tsd, tcache_slow, tcache, mem,
	    tcache_get_default_ncached_max());

	tcache_arena_associate(tsd_tsdn(tsd), tcache_slow, tcache,
	    arena_ichoose(tsd, NULL));

	return tcache;
}